

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
HdlcSimulationDataGenerator::HdlcSimulationDataGenerator(HdlcSimulationDataGenerator *this)

{
  this->mSettings = (HdlcAnalyzerSettings *)0x0;
  this->mSimulationSampleRateHz = 0;
  (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mFrameNumber = 0;
  this->mAbortByte = 0;
  *(undefined8 *)((long)&this->mAbortByte + 3) = 0;
  SimulationChannelDescriptor::SimulationChannelDescriptor(&this->mHdlcSimulationData);
  this->mFrameTypes[0] = HDLC_I_FRAME;
  this->mFrameTypes[1] = HDLC_S_FRAME;
  this->mSamplesInHalfPeriod = 0;
  this->mSamplesInAFlag = 0;
  this->mFrameTypes[2] = HDLC_U_FRAME;
  return;
}

Assistant:

HdlcSimulationDataGenerator::HdlcSimulationDataGenerator()
    : mSettings( 0 ),
      mSimulationSampleRateHz( 0 ),
      mFrameNumber( 0 ),
      mAbortByte( 0 ),
      mWrongFramesSeparation( 0 ),
      mControlValue( 0 ),
      mAddresByteValue( 0 ),
      mInformationByteValue( 0 ),
      mSamplesInHalfPeriod( 0 ),
      mSamplesInAFlag( 0 )

{
    mFrameTypes[ 0 ] = HDLC_I_FRAME;
    mFrameTypes[ 1 ] = HDLC_S_FRAME;
    mFrameTypes[ 2 ] = HDLC_U_FRAME;
}